

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O3

bool llvm::formatv_object_base::consumeFieldLayout
               (StringRef *Spec,AlignStyle *Where,size_t *Align,char *Pad)

{
  char cVar1;
  bool bVar2;
  AlignStyle AVar3;
  size_t in_RAX;
  size_t sVar4;
  char *pcVar5;
  size_t local_18;
  unsigned_long_long ULLVal;
  
  *Where = Right;
  *Align = 0;
  *Pad = ' ';
  sVar4 = Spec->Length;
  if (sVar4 == 0) {
    return true;
  }
  if (sVar4 == 1) goto LAB_00d963f4;
  pcVar5 = Spec->Data;
  cVar1 = pcVar5[1];
  if (cVar1 == '+') {
    AVar3 = Right;
LAB_00d963a6:
    *Pad = *pcVar5;
    *Where = AVar3;
    if (Spec->Length < 2) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                    ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
    }
    pcVar5 = Spec->Data + 2;
    sVar4 = Spec->Length - 2;
  }
  else {
    if (cVar1 == '-') {
      AVar3 = Left;
      goto LAB_00d963a6;
    }
    if (cVar1 == '=') {
      AVar3 = Center;
      goto LAB_00d963a6;
    }
    cVar1 = *pcVar5;
    if (cVar1 == '+') {
      AVar3 = Right;
    }
    else if (cVar1 == '-') {
      AVar3 = Left;
    }
    else {
      if (cVar1 != '=') goto LAB_00d963f4;
      AVar3 = Center;
    }
    pcVar5 = pcVar5 + 1;
    *Where = AVar3;
    sVar4 = sVar4 - 1;
  }
  Spec->Data = pcVar5;
  Spec->Length = sVar4;
LAB_00d963f4:
  local_18 = in_RAX;
  bVar2 = consumeUnsignedInteger(Spec,0,&local_18);
  if (!bVar2) {
    *Align = local_18;
  }
  return !bVar2;
}

Assistant:

bool formatv_object_base::consumeFieldLayout(StringRef &Spec, AlignStyle &Where,
                                             size_t &Align, char &Pad) {
  Where = AlignStyle::Right;
  Align = 0;
  Pad = ' ';
  if (Spec.empty())
    return true;

  if (Spec.size() > 1) {
    // A maximum of 2 characters at the beginning can be used for something
    // other
    // than the width.
    // If Spec[1] is a loc char, then Spec[0] is a pad char and Spec[2:...]
    // contains the width.
    // Otherwise, if Spec[0] is a loc char, then Spec[1:...] contains the width.
    // Otherwise, Spec[0:...] contains the width.
    if (auto Loc = translateLocChar(Spec[1])) {
      Pad = Spec[0];
      Where = *Loc;
      Spec = Spec.drop_front(2);
    } else if (auto Loc = translateLocChar(Spec[0])) {
      Where = *Loc;
      Spec = Spec.drop_front(1);
    }
  }

  bool Failed = Spec.consumeInteger(0, Align);
  return !Failed;
}